

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O0

jint Java_beagle_BeagleJNIWrapper_updateTransitionMatrices
               (JNIEnv *env,jobject obj,jint instance,jint eigenIndex,jintArray inProbabilityIndices
               ,jintArray inFirstDerivativeIndices,jintArray inSecondDerivativeIndices,
               jdoubleArray inEdgeLengths,jint count)

{
  jint jVar1;
  jint *pjVar2;
  jdoubleArray p_Var3;
  JNIEnv_ *this;
  jdouble *pjVar4;
  undefined4 in_ECX;
  undefined4 in_EDX;
  long in_R9;
  long in_stack_00000008;
  undefined4 in_stack_00000018;
  jint errCode;
  jdouble *edgeLengths;
  jint *secondDerivativeIndices;
  jint *firstDerivativeIndices;
  jint *probabilityIndices;
  undefined4 in_stack_ffffffffffffff98;
  jint in_stack_ffffffffffffff9c;
  JNIEnv_ *in_stack_ffffffffffffffa0;
  JNIEnv_ *elems;
  jdoubleArray p_Var5;
  undefined4 in_stack_ffffffffffffffb0;
  
  pjVar2 = JNIEnv_::GetIntArrayElements
                     (in_stack_ffffffffffffffa0,
                      (jintArray)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (jboolean *)0x105614);
  if (in_R9 == 0) {
    p_Var3 = (jdoubleArray)0x0;
  }
  else {
    p_Var3 = (jdoubleArray)
             JNIEnv_::GetIntArrayElements
                       (in_stack_ffffffffffffffa0,
                        (jintArray)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                        (jboolean *)0x105634);
  }
  p_Var5 = p_Var3;
  if (in_stack_00000008 == 0) {
    this = (JNIEnv_ *)0x0;
  }
  else {
    this = (JNIEnv_ *)
           JNIEnv_::GetIntArrayElements
                     (in_stack_ffffffffffffffa0,
                      (jintArray)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (jboolean *)0x105669);
  }
  elems = this;
  pjVar4 = JNIEnv_::GetDoubleArrayElements
                     (this,(jdoubleArray)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (jboolean *)0x105696);
  jVar1 = beagleUpdateTransitionMatrices(in_EDX,in_ECX,pjVar2,p_Var3,this,pjVar4,in_stack_00000018);
  JNIEnv_::ReleaseDoubleArrayElements
            ((JNIEnv_ *)CONCAT44(jVar1,in_stack_ffffffffffffffb0),p_Var5,(jdouble *)elems,
             in_stack_ffffffffffffff9c);
  if (in_stack_00000008 != 0) {
    JNIEnv_::ReleaseIntArrayElements
              ((JNIEnv_ *)CONCAT44(jVar1,in_stack_ffffffffffffffb0),(jintArray)p_Var5,(jint *)elems,
               in_stack_ffffffffffffff9c);
  }
  if (in_R9 != 0) {
    JNIEnv_::ReleaseIntArrayElements
              ((JNIEnv_ *)CONCAT44(jVar1,in_stack_ffffffffffffffb0),(jintArray)p_Var5,(jint *)elems,
               in_stack_ffffffffffffff9c);
  }
  JNIEnv_::ReleaseIntArrayElements
            ((JNIEnv_ *)CONCAT44(jVar1,in_stack_ffffffffffffffb0),(jintArray)p_Var5,(jint *)elems,
             in_stack_ffffffffffffff9c);
  return jVar1;
}

Assistant:

JNIEXPORT jint JNICALL Java_beagle_BeagleJNIWrapper_updateTransitionMatrices
  (JNIEnv *env, jobject obj, jint instance, jint eigenIndex, jintArray inProbabilityIndices, jintArray inFirstDerivativeIndices, jintArray inSecondDerivativeIndices, jdoubleArray inEdgeLengths, jint count)
{
    jint *probabilityIndices = env->GetIntArrayElements(inProbabilityIndices, NULL);
    jint *firstDerivativeIndices = inFirstDerivativeIndices != NULL ? env->GetIntArrayElements(inFirstDerivativeIndices, NULL) : NULL;
    jint *secondDerivativeIndices = inSecondDerivativeIndices != NULL ? env->GetIntArrayElements(inSecondDerivativeIndices, NULL) : NULL;
    jdouble *edgeLengths = env->GetDoubleArrayElements(inEdgeLengths, NULL);
    jint errCode = (jint)beagleUpdateTransitionMatrices(instance, eigenIndex, (int *)probabilityIndices, (int *)firstDerivativeIndices, (int *)secondDerivativeIndices, (double *)edgeLengths, count);

    env->ReleaseDoubleArrayElements(inEdgeLengths, edgeLengths, JNI_ABORT);
    if (inSecondDerivativeIndices != NULL) env->ReleaseIntArrayElements(inSecondDerivativeIndices, secondDerivativeIndices, JNI_ABORT);
    if (inFirstDerivativeIndices != NULL) env->ReleaseIntArrayElements(inFirstDerivativeIndices, firstDerivativeIndices, JNI_ABORT);
    env->ReleaseIntArrayElements(inProbabilityIndices, probabilityIndices, JNI_ABORT);

    return errCode;
}